

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

void secp256k1_nonce_function_musig_helper
               (secp256k1_sha256 *sha,uint prefix_size,uchar *data,uchar len)

{
  uchar zero [7];
  uchar local_21;
  uchar local_20 [8];
  
  local_20[4] = '\0';
  local_20[5] = '\0';
  local_20[6] = '\0';
  local_20[0] = '\0';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_21 = len;
  secp256k1_sha256_write(sha,local_20,(ulong)(prefix_size - 1));
  if (data != (uchar *)0x0) {
    secp256k1_sha256_write(sha,&local_21,1);
    secp256k1_sha256_write(sha,data,(ulong)len);
    return;
  }
  local_21 = '\0';
  secp256k1_sha256_write(sha,&local_21,1);
  return;
}

Assistant:

static void secp256k1_nonce_function_musig_helper(secp256k1_sha256 *sha, unsigned int prefix_size, const unsigned char *data, unsigned char len) {
    unsigned char zero[7] = { 0 };
    /* The spec requires length prefixes to be between 1 and 8 bytes
     * (inclusive) */
    VERIFY_CHECK(prefix_size >= 1 && prefix_size <= 8);
    /* Since the length of all input data fits in a byte, we can always pad the
     * length prefix with prefix_size - 1 zero bytes. */
    secp256k1_sha256_write(sha, zero, prefix_size - 1);
    if (data != NULL) {
        secp256k1_sha256_write(sha, &len, 1);
        secp256k1_sha256_write(sha, data, len);
    } else {
        len = 0;
        secp256k1_sha256_write(sha, &len, 1);
    }
}